

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

uint __thiscall llvm::ARM::parseFPU(ARM *this,StringRef FPU)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  
  pcVar6 = FPU.Data;
  if (pcVar6 == (char *)0x3) {
    bVar8 = this[2] == (ARM)0x61 && *(short *)this == 0x7066;
  }
  else {
    bVar8 = false;
  }
  bVar2 = bVar8;
  if (((pcVar6 == (char *)0x4) && (!bVar8)) && (bVar2 = true, *(int *)this != 0x32657066)) {
    bVar2 = bVar8;
  }
  bVar8 = bVar2;
  if (((pcVar6 == (char *)0x4) && (!bVar2)) && (bVar8 = true, *(int *)this != 0x33657066)) {
    bVar8 = bVar2;
  }
  bVar2 = bVar8;
  if (((pcVar6 == (char *)0x8) && (!bVar8)) && (bVar2 = true, *(long *)this != 0x6b6369726576616d))
  {
    bVar2 = bVar8;
  }
  pcVar4 = (char *)0x7;
  pcVar5 = "invalid";
  if (((pcVar6 == (char *)0x4) && (!bVar2)) && (*(int *)this == 0x32706676)) {
    bVar2 = true;
    pcVar4 = (char *)0x5;
    pcVar5 = "vfpv2";
  }
  if (((pcVar6 == (char *)0x4) && (!bVar2)) && (*(int *)this == 0x33706676)) {
    bVar2 = true;
    pcVar4 = (char *)0x5;
    pcVar5 = "vfpv3";
  }
  if (((pcVar6 == (char *)0x4) && (!bVar2)) && (*(int *)this == 0x34706676)) {
    bVar2 = true;
    pcVar4 = (char *)0x5;
    pcVar5 = "vfpv4";
  }
  if (((pcVar6 == (char *)0x8) && (!bVar2)) && (*(long *)this == 0x3631642d33706676)) {
    bVar2 = true;
    pcVar4 = (char *)0x9;
    pcVar5 = "vfpv3-d16";
  }
  if (((pcVar6 == (char *)0x8) && (!bVar2)) && (*(long *)this == 0x3631642d34706676)) {
    bVar2 = true;
    pcVar4 = (char *)0x9;
    pcVar5 = "vfpv4-d16";
  }
  if (((pcVar6 == (char *)0xa) && (!bVar2)) &&
     (*(short *)(this + 8) == 0x3631 && *(long *)this == 0x642d70732d347066)) {
    bVar2 = true;
    pcVar4 = (char *)0xb;
    pcVar5 = "fpv4-sp-d16";
  }
  if (((pcVar6 == (char *)0xc) && (!bVar2)) &&
     (*(int *)(this + 8) == 0x3631642d && *(long *)this == 0x70732d3476706676)) {
    bVar2 = true;
    pcVar4 = (char *)0xb;
    pcVar5 = "fpv4-sp-d16";
  }
  if (((pcVar6 == (char *)0xa) && (!bVar2)) &&
     (*(short *)(this + 8) == 0x3631 && *(long *)this == 0x642d70642d347066)) {
    bVar2 = true;
    pcVar4 = (char *)0x9;
    pcVar5 = "vfpv4-d16";
  }
  if (((pcVar6 == (char *)0xb) && (!bVar2)) &&
     (*(long *)(this + 3) == 0x3631642d70642d34 && *(long *)this == 0x2d70642d34767066)) {
    bVar2 = true;
    pcVar4 = (char *)0x9;
    pcVar5 = "vfpv4-d16";
  }
  if (((pcVar6 == (char *)0xa) && (!bVar2)) &&
     (*(short *)(this + 8) == 0x3631 && *(long *)this == 0x642d70732d357066)) {
    bVar2 = true;
    pcVar4 = (char *)0xb;
    pcVar5 = "fpv5-sp-d16";
  }
  if (((pcVar6 == (char *)0xa) && (!bVar2)) &&
     (*(short *)(this + 8) == 0x3631 && *(long *)this == 0x642d70642d357066)) {
    bVar2 = true;
    pcVar4 = (char *)0x8;
    pcVar5 = "fpv5-d16";
  }
  if (((pcVar6 == (char *)0xb) && (!bVar2)) &&
     (*(long *)(this + 3) == 0x3631642d70642d35 && *(long *)this == 0x2d70642d35767066)) {
    bVar2 = true;
    pcVar4 = (char *)0x8;
    pcVar5 = "fpv5-d16";
  }
  if (((pcVar6 == (char *)0xa) && (!bVar2)) &&
     (*(short *)(this + 8) == 0x3376 && *(long *)this == 0x7066762d6e6f656e)) {
    bVar2 = true;
    pcVar4 = (char *)0x4;
    pcVar5 = "neon";
  }
  if (bVar2) {
    pcVar6 = pcVar4;
    this = (ARM *)pcVar5;
  }
  lVar7 = 0x10;
  while( true ) {
    pcVar4 = *(char **)(&UNK_00205418 + lVar7);
    uVar1 = *(uint *)((long)&(anonymous_namespace)::FPUNames + lVar7);
    if (pcVar6 == pcVar4) {
      if (pcVar4 == (char *)0x0) {
        bVar8 = true;
      }
      else {
        iVar3 = bcmp(this,*(void **)((long)&PTR___cxa_pure_virtual_00205410 + lVar7),(size_t)pcVar4)
        ;
        bVar8 = iVar3 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) break;
    lVar7 = lVar7 + 0x20;
    if (lVar7 == 0x2d0) {
      return 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned llvm::ARM::parseFPU(StringRef FPU) {
  StringRef Syn = getFPUSynonym(FPU);
  for (const auto F : FPUNames) {
    if (Syn == F.getName())
      return F.ID;
  }
  return ARM::FK_INVALID;
}